

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryScatter<duckdb::ArgMinMaxState<long,duckdb::hugeint_t>,long,duckdb::hugeint_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,Vector *states,idx_t count)

{
  ulong uVar1;
  ulong uVar2;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  AggregateBinaryInput local_130;
  long *local_108;
  long local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  long *local_c0;
  long local_b8;
  ValidityMask local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  ValidityMask local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_108);
  duckdb::Vector::ToUnifiedFormat((ulong)a,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)b,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  local_130.left_mask = &local_68;
  local_130.right_mask = &local_b0;
  local_130.input = aggr_input_data;
  if (count != 0) {
    uVar2 = 0;
    do {
      local_130.lidx = uVar2;
      if (*local_78 != 0) {
        local_130.lidx = (idx_t)*(uint *)(*local_78 + uVar2 * 4);
      }
      local_130.ridx = uVar2;
      if (*local_c0 != 0) {
        local_130.ridx = (idx_t)*(uint *)(*local_c0 + uVar2 * 4);
      }
      uVar1 = uVar2;
      if (*local_108 != 0) {
        uVar1 = (ulong)*(uint *)(*local_108 + uVar2 * 4);
      }
      ArgMinMaxBase<duckdb::GreaterThan,false>::
      Operation<long,duckdb::hugeint_t,duckdb::ArgMinMaxState<long,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
                (*(ArgMinMaxState<long,_duckdb::hugeint_t> **)(local_100 + uVar1 * 8),
                 (long *)(local_70 + local_130.lidx * 8),
                 (hugeint_t *)(local_130.ridx * 0x10 + local_b8),&local_130);
      uVar2 = uVar2 + 1;
    } while (count != uVar2);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_b0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void BinaryScatter(AggregateInputData &aggr_input_data, Vector &a, Vector &b, Vector &states, idx_t count) {
		UnifiedVectorFormat adata, bdata, sdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);
		states.ToUnifiedFormat(count, sdata);

		BinaryScatterLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE **)sdata.data, count, *adata.sel, *bdata.sel, *sdata.sel, adata.validity, bdata.validity);
	}